

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

bool __thiscall BloomFilter::exists(BloomFilter *this,uint64_t key)

{
  bool bVar1;
  bool local_29;
  uint local_28;
  uint local_24;
  uint hash [4];
  uint64_t key_local;
  BloomFilter *this_local;
  
  hash._8_8_ = key;
  memset(&local_28,0,0x10);
  MurmurHash3_x64_128(hash + 2,8,1,&local_28);
  bVar1 = std::bitset<81920UL>::operator[](&this->bits,(ulong)local_28 % 0x14000);
  local_29 = false;
  if (bVar1) {
    bVar1 = std::bitset<81920UL>::operator[](&this->bits,(ulong)local_24 % 0x14000);
    local_29 = false;
    if (bVar1) {
      bVar1 = std::bitset<81920UL>::operator[](&this->bits,(ulong)hash[0] % 0x14000);
      local_29 = false;
      if (bVar1) {
        local_29 = std::bitset<81920UL>::operator[](&this->bits,(ulong)hash[1] % 0x14000);
      }
    }
  }
  return local_29;
}

Assistant:

bool BloomFilter::exists(uint64_t key) const {
  unsigned int hash[4] = {0};
  MurmurHash3_x64_128(&key, sizeof(key), 1, &hash);
  return bits[hash[0] % (10240 * 8)] && bits[hash[1] % (10240 * 8)] &&
         bits[hash[2] % (10240 * 8)] && bits[hash[3] % (10240 * 8)];
}